

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  int iVar1;
  Type TVar2;
  TestPartResult *pTVar3;
  AssertionResult *pAVar4;
  AssertionResult *other;
  char *pcVar5;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  undefined8 in_RDI;
  Type in_R9D;
  AssertionResult AVar6;
  TestPartResult *r;
  int i;
  Message msg;
  string expected;
  TestPartResult *in_stack_fffffffffffffe58;
  Message *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  TestPartResultArray *in_stack_fffffffffffffe70;
  TestPartResult *in_stack_fffffffffffffe88;
  AssertionResult *in_stack_fffffffffffffe90;
  AssertionResult *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  int local_78;
  allocator<char> local_51;
  string local_50 [36];
  Type local_2c;
  
  local_2c = in_R9D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->success_,
             (allocator<char> *)in_stack_fffffffffffffe90);
  std::allocator<char>::~allocator(&local_51);
  Message::Message((Message *)in_stack_fffffffffffffe90);
  iVar1 = TestPartResultArray::size((TestPartResultArray *)0x10c013);
  if (iVar1 == 1) {
    pTVar3 = TestPartResultArray::GetTestPartResult
                       (in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    TVar2 = TestPartResult::type(pTVar3);
    if (TVar2 == local_2c) {
      pAVar4 = (AssertionResult *)TestPartResult::message((TestPartResult *)0x10c3bf);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar5 = strstr(&pAVar4->success_,pcVar5);
      if (pcVar5 == (char *)0x0) {
        AssertionFailure();
        pTVar3 = (TestPartResult *)
                 AssertionResult::operator<<(pAVar4,(char (*) [11])in_stack_fffffffffffffe88);
        AssertionResult::operator<<
                  (pAVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          pTVar3);
        AssertionResult::operator<<(pAVar4,(char (*) [14])pTVar3);
        AssertionResult::operator<<
                  (pAVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          pTVar3);
        AssertionResult::operator<<(pAVar4,(char (*) [3])pTVar3);
        AssertionResult::operator<<(pAVar4,(char (*) [11])pTVar3);
        AssertionResult::operator<<(pAVar4,pTVar3);
        AssertionResult::AssertionResult
                  ((AssertionResult *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        AssertionResult::~AssertionResult((AssertionResult *)0x10c4c6);
      }
      else {
        AssertionSuccess();
      }
    }
    else {
      AssertionFailure();
      AssertionResult::operator<<
                (in_stack_fffffffffffffe90,(char (*) [11])in_stack_fffffffffffffe88);
      AssertionResult::operator<<
                (in_stack_fffffffffffffe90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe88);
      AssertionResult::operator<<(in_stack_fffffffffffffe90,(char (*) [2])in_stack_fffffffffffffe88)
      ;
      pAVar4 = AssertionResult::operator<<
                         (in_stack_fffffffffffffe90,(char (*) [11])in_stack_fffffffffffffe88);
      other = AssertionResult::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      AssertionResult::AssertionResult(pAVar4,other);
      AssertionResult::~AssertionResult((AssertionResult *)0x10c37c);
    }
  }
  else {
    Message::operator<<(in_stack_fffffffffffffe60,(char (*) [11])in_stack_fffffffffffffe58);
    Message::operator<<(in_stack_fffffffffffffe60,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffe58);
    Message::operator<<(in_stack_fffffffffffffe60,(char (*) [2])in_stack_fffffffffffffe58);
    Message::operator<<(in_stack_fffffffffffffe60,(char (*) [11])in_stack_fffffffffffffe58);
    TestPartResultArray::size((TestPartResultArray *)0x10c0b2);
    Message::operator<<(in_stack_fffffffffffffe60,(int *)in_stack_fffffffffffffe58);
    Message::operator<<(in_stack_fffffffffffffe60,(char (*) [10])in_stack_fffffffffffffe58);
    for (local_78 = 0; iVar1 = TestPartResultArray::size((TestPartResultArray *)0x10c124),
        local_78 < iVar1; local_78 = local_78 + 1) {
      Message::operator<<(in_stack_fffffffffffffe60,(char (*) [2])in_stack_fffffffffffffe58);
      TestPartResultArray::GetTestPartResult
                (in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      Message::operator<<(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    }
    AssertionFailure();
    AssertionResult::operator<<(in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88);
    AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    AssertionResult::~AssertionResult((AssertionResult *)0x10c252);
  }
  Message::~Message((Message *)0x10c51d);
  std::__cxx11::string::~string(local_50);
  AVar6.message_.ptr_ = extraout_RDX.ptr_;
  AVar6._0_8_ = in_RDI;
  return AVar6;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const std::string expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}